

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

void Abc_NtkInsertMfs(Abc_Ntk_t *pNtk,Sfm_Ntk_t *p)

{
  Mem_Flex_t *pMan;
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *vCover_00;
  Vec_Int_t *p_01;
  Abc_Obj_t *pFanin;
  word *pTruth_00;
  char *pcVar5;
  int local_48;
  int Fanin;
  int k;
  int i;
  word *pTruth;
  Abc_Obj_t *pNode;
  Vec_Int_t *vArray;
  Vec_Int_t *vMap;
  Vec_Int_t *vCover;
  Sfm_Ntk_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p_00 = Vec_IntStart(iVar1);
  for (Fanin = 0; iVar1 = Abc_NtkCiNum(pNtk), Fanin < iVar1; Fanin = Fanin + 1) {
    pAVar4 = Abc_NtkCi(pNtk,Fanin);
    iVar1 = (pAVar4->field_6).iTemp;
    uVar2 = Abc_ObjId(pAVar4);
    Vec_IntWriteEntry(p_00,iVar1,uVar2);
  }
  for (Fanin = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Fanin < iVar1; Fanin = Fanin + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Fanin);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (0 < (pAVar4->field_6).iTemp)) {
      iVar1 = (pAVar4->field_6).iTemp;
      uVar2 = Abc_ObjId(pAVar4);
      Vec_IntWriteEntry(p_00,iVar1,uVar2);
    }
  }
  for (Fanin = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Fanin < iVar1; Fanin = Fanin + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Fanin);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (iVar1 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp), iVar1 == 0)) {
      Abc_ObjRemoveFanins(pAVar4);
    }
  }
  vCover_00 = Vec_IntAlloc(0x10000);
  Fanin = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= Fanin) {
      Vec_IntFree(vCover_00);
      Vec_IntFree(p_00);
      return;
    }
    pAVar4 = Abc_NtkObj(pNtk,Fanin);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       (((pAVar4->field_6).iTemp != 0 &&
        (iVar1 = Sfm_NodeReadFixed(p,(pAVar4->field_6).iTemp), iVar1 == 0)))) {
      iVar1 = Sfm_NodeReadUsed(p,(pAVar4->field_6).iTemp);
      if (iVar1 == 0) {
        Abc_NtkDeleteObj(pAVar4);
      }
      else {
        p_01 = Sfm_NodeReadFanins(p,(pAVar4->field_6).iTemp);
        for (local_48 = 0; iVar1 = Vec_IntSize(p_01), local_48 < iVar1; local_48 = local_48 + 1) {
          iVar1 = Vec_IntEntry(p_01,local_48);
          iVar1 = Vec_IntEntry(p_00,iVar1);
          pFanin = Abc_NtkObj(pNtk,iVar1);
          Abc_ObjAddFanin(pAVar4,pFanin);
        }
        pTruth_00 = Sfm_NodeReadTruth(p,(pAVar4->field_6).iTemp);
        pMan = (Mem_Flex_t *)pNtk->pManFunc;
        iVar1 = Vec_IntSize(p_01);
        pcVar5 = Abc_SopCreateFromTruthIsop(pMan,iVar1,pTruth_00,vCover_00);
        (pAVar4->field_5).pData = pcVar5;
        iVar1 = Abc_SopGetVarNum((char *)(pAVar4->field_5).pData);
        iVar3 = Vec_IntSize(p_01);
        if (iVar1 != iVar3) {
          __assert_fail("Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                        ,0x14b,"void Abc_NtkInsertMfs(Abc_Ntk_t *, Sfm_Ntk_t *)");
        }
      }
    }
    Fanin = Fanin + 1;
  } while( true );
}

Assistant:

void Abc_NtkInsertMfs( Abc_Ntk_t * pNtk, Sfm_Ntk_t * p )
{
    Vec_Int_t * vCover, * vMap, * vArray;
    Abc_Obj_t * pNode;
    word * pTruth;
    int i, k, Fanin;
    // map new IDs into old nodes
    vMap = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( pNode->iTemp > 0 )
            Vec_IntWriteEntry( vMap, pNode->iTemp, Abc_ObjId(pNode) );
    // remove old fanins
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Sfm_NodeReadFixed(p, pNode->iTemp) )
            Abc_ObjRemoveFanins( pNode );
    // create new fanins
    vCover = Vec_IntAlloc( 1 << 16 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->iTemp == 0 || Sfm_NodeReadFixed(p, pNode->iTemp) )
            continue;
        if ( !Sfm_NodeReadUsed(p, pNode->iTemp) )
        {
            Abc_NtkDeleteObj( pNode );
            continue;
        }
        // update fanins
        vArray = Sfm_NodeReadFanins( p, pNode->iTemp );
        Vec_IntForEachEntry( vArray, Fanin, k )
            Abc_ObjAddFanin( pNode, Abc_NtkObj(pNtk, Vec_IntEntry(vMap, Fanin)) );
        pTruth = Sfm_NodeReadTruth( p, pNode->iTemp );
        pNode->pData = Abc_SopCreateFromTruthIsop( (Mem_Flex_t *)pNtk->pManFunc, Vec_IntSize(vArray), pTruth, vCover );
        assert( Abc_SopGetVarNum((char *)pNode->pData) == Vec_IntSize(vArray) );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vMap );
}